

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::addLogger(SimpleLoggerMgr *this,SimpleLogger *logger)

{
  mutex_type *in_RDI;
  pair<std::__detail::_Node_iterator<SimpleLogger_*,_true,_false>,_bool> pVar1;
  unique_lock<std::mutex> l;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  value_type *in_stack_ffffffffffffffb8;
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  *in_stack_ffffffffffffffc0;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_RDI);
  pVar1 = std::
          unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
          ::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT17(pVar1.second,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void SimpleLoggerMgr::addLogger(SimpleLogger* logger) {
    std::unique_lock<std::mutex> l(loggersLock);
    loggers.insert(logger);
}